

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_config_find_param.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  value v;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  string path;
  ifstream in;
  byte abStack_210 [488];
  
  if (argc == 3) {
    std::ifstream::ifstream(&in,argv[2],_S_in);
    if ((abStack_210[*(long *)(_in + -0x18)] & 5) == 0) {
      cppcms::json::value::copyable::copyable(&v.d);
      bVar1 = cppcms::json::value::load(&v,(istream *)&in,true,(int *)0x0);
      if (bVar1) {
        std::__cxx11::string::string((string *)&path,argv[1],(allocator *)&sep);
        dVar3 = cppcms::json::value::get<double>(&v,&path);
        std::ostream::_M_insert<double>(dVar3);
        std::__cxx11::string::~string((string *)&path);
      }
      uVar2 = (uint)!bVar1;
      cppcms::json::value::copyable::~copyable(&v.d);
    }
    else {
      uVar2 = 1;
    }
    std::ifstream::~ifstream(&in);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int main(int argc,char **argv)
{
	using namespace cppcms;
	if(argc!=3)
		return 1;
	std::ifstream in(argv[2]);
	if(!in)
		return 1;
	
	json::value v;
	if(!v.load(in,true))
		return 1;
	std::string path=argv[1];
	try {
		std::cout<<v.get<double>(path);
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::cout<<v.get<std::string>(path);
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::cout<< (v.get<bool>(path) ? "true" : "false" );
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	try {
		std::vector<std::string> vs=v.get<std::vector<std::string> >(path);
		std::string sep="";
		for(unsigned i=0;i<vs.size();i++) {
			std::cout<<sep<<vs[i];
			sep=" ";
		}
		return 0;
	}
	catch(json::bad_value_cast const  &e) {}
	return 1;
}